

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  Message *pMVar2;
  Int32 result;
  Message local_28;
  char *var_local;
  
  var_local = var;
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message(&local_28);
    pMVar2 = Message::operator<<(&local_28,(char (*) [35])"The value of environment variable ");
    pMVar2 = Message::operator<<(pMVar2,&var_local);
    bVar1 = ParseInt32(pMVar2,str,&result);
    if (local_28.ss_ != (StrStream *)0x0) {
      (**(code **)(*(long *)local_28.ss_ + 8))();
    }
    default_val = result;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* const var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}